

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::SourceRange>::
emplace_back<slang::SourceLocation&,slang::SourceLocation&>
          (SmallVectorBase<slang::SourceRange> *this,SourceLocation *args,SourceLocation *args_1)

{
  SourceLocation SVar1;
  ulong uVar2;
  pointer p;
  pointer pSVar3;
  pointer pSVar4;
  pointer pSVar5;
  long lVar6;
  ulong uVar7;
  pointer __src;
  size_type sVar8;
  long lVar9;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    SVar1 = *args_1;
    __src->startLoc = *args;
    __src->endLoc = SVar1;
    sVar8 = this->len;
    this->len = sVar8 + 1;
    return this->data_ + sVar8;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar7 = this->len + 1;
  uVar2 = this->cap;
  if (uVar7 < uVar2 * 2) {
    uVar7 = uVar2 * 2;
  }
  if (0x7ffffffffffffff - uVar2 < uVar2) {
    uVar7 = 0x7ffffffffffffff;
  }
  lVar9 = (long)__src - (long)this->data_;
  pSVar3 = (pointer)operator_new(uVar7 << 4);
  SVar1 = *args_1;
  *(SourceLocation *)((long)pSVar3 + lVar9) = *args;
  *(SourceLocation *)((long)pSVar3 + lVar9 + 8) = SVar1;
  p = this->data_;
  sVar8 = this->len;
  lVar6 = (long)p + (sVar8 * 0x10 - (long)__src);
  pSVar4 = p;
  pSVar5 = pSVar3;
  if (lVar6 == 0) {
    pSVar4 = pSVar3;
    pSVar5 = p;
    if (sVar8 != 0) {
      do {
        SVar1 = pSVar5->endLoc;
        pSVar4->startLoc = pSVar5->startLoc;
        pSVar4->endLoc = SVar1;
        pSVar5 = pSVar5 + 1;
        pSVar4 = pSVar4 + 1;
      } while (pSVar5 != __src);
    }
  }
  else {
    for (; pSVar4 != __src; pSVar4 = pSVar4 + 1) {
      SVar1 = pSVar4->endLoc;
      pSVar5->startLoc = pSVar4->startLoc;
      pSVar5->endLoc = SVar1;
      pSVar5 = pSVar5 + 1;
    }
    memcpy((void *)((long)pSVar3 + lVar9 + 0x10),__src,(lVar6 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar8 = this->len;
  }
  this->len = sVar8 + 1;
  this->cap = uVar7;
  this->data_ = pSVar3;
  return (reference)((long)pSVar3 + lVar9);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }